

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.h
# Opt level: O0

void __thiscall
cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(ConfidentialTxOutReference *this)

{
  ConfidentialTxOutReference *this_local;
  
  ~ConfidentialTxOutReference(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~ConfidentialTxOutReference() {
    // do nothing
  }